

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::Run
          (StatisticsAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer
          )

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  size_type __new_size;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  Row local_50;
  double local_38;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar7 = false;
  if ((buffer != (Buffer *)0x0) &&
     (__new_size = (long)this->num_order_ + 1, bVar7 = false,
     (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size)) {
    iVar8 = this->num_statistics_order_;
    if (0 < iVar8) {
      if ((long)(buffer->first_order_statistics_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(buffer->first_order_statistics_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize
                  (&buffer->first_order_statistics_,__new_size);
        iVar8 = this->num_statistics_order_;
      }
      if ((1 < iVar8) && ((buffer->second_order_statistics_).num_dimension_ != (int)__new_size)) {
        SymmetricMatrix::Resize(&buffer->second_order_statistics_,(int)__new_size);
      }
    }
    if ((this->numerically_stable_ == true) &&
       ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size)) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->delta_,__new_size);
    }
    iVar2 = buffer->zeroth_order_statistics_;
    iVar8 = iVar2 + 1;
    buffer->zeroth_order_statistics_ = iVar8;
    iVar3 = this->num_statistics_order_;
    bVar7 = true;
    if (0 < iVar3) {
      if (this->numerically_stable_ == true) {
        pdVar9 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pdVar5 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar9 != pdVar4) {
          pdVar6 = (buffer->first_order_statistics_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = 0;
          do {
            pdVar10 = (double *)((long)pdVar9 + lVar11);
            *(double *)((long)pdVar5 + lVar11) = *pdVar10 - *(double *)((long)pdVar6 + lVar11);
            lVar11 = lVar11 + 8;
          } while (pdVar10 + 1 != pdVar4);
        }
        if ((iVar3 != 1) && (-1 < this->num_order_)) {
          local_38 = (double)iVar2 / (double)iVar8;
          uVar13 = 0;
          do {
            uVar12 = uVar13 & 0xffffffff;
            if (this->diagonal_ == false) {
              uVar12 = 0;
            }
            do {
              dVar14 = pdVar5[uVar13] * local_38;
              dVar1 = pdVar5[uVar12];
              local_50._vptr_Row = (_func_int **)&PTR__Row_00111d28;
              local_50.matrix_ = &buffer->second_order_statistics_;
              local_50.row_ = (int)uVar13;
              pdVar9 = SymmetricMatrix::Row::operator[](&local_50,(int)uVar12);
              *pdVar9 = dVar14 * dVar1 + *pdVar9;
              uVar12 = uVar12 + 1;
            } while (uVar13 + 1 != uVar12);
            bVar7 = (long)uVar13 < (long)this->num_order_;
            uVar13 = uVar13 + 1;
          } while (bVar7);
        }
      }
      else if ((iVar3 != 1) && (-1 < this->num_order_)) {
        uVar13 = 0;
        do {
          uVar12 = uVar13 & 0xffffffff;
          if (this->diagonal_ == false) {
            uVar12 = 0;
          }
          do {
            pdVar5 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar1 = pdVar5[uVar13];
            dVar14 = pdVar5[uVar12];
            local_50._vptr_Row = (_func_int **)&PTR__Row_00111d28;
            local_50.matrix_ = &buffer->second_order_statistics_;
            local_50.row_ = (int)uVar13;
            pdVar9 = SymmetricMatrix::Row::operator[](&local_50,(int)uVar12);
            *pdVar9 = dVar1 * dVar14 + *pdVar9;
            uVar12 = uVar12 + 1;
          } while (uVar13 + 1 != uVar12);
          bVar7 = (long)uVar13 < (long)this->num_order_;
          uVar13 = uVar13 + 1;
        } while (bVar7);
      }
      if (this->num_statistics_order_ < 1) {
        bVar7 = true;
      }
      else {
        bVar7 = true;
        if (this->numerically_stable_ == true) {
          pdVar9 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar9 != pdVar4) {
            iVar8 = buffer->zeroth_order_statistics_;
            pdVar10 = (buffer->first_order_statistics_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              *pdVar10 = *pdVar9 * (1.0 / (double)iVar8) + *pdVar10;
              pdVar9 = pdVar9 + 1;
              pdVar10 = pdVar10 + 1;
            } while (pdVar9 != pdVar4);
          }
        }
        else {
          pdVar9 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar9 != pdVar4) {
            pdVar10 = (buffer->first_order_statistics_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              *pdVar10 = *pdVar9 + *pdVar10;
              pdVar9 = pdVar9 + 1;
              pdVar10 = pdVar10 + 1;
            } while (pdVar9 != pdVar4);
          }
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool StatisticsAccumulation::Run(const std::vector<double>& data,
                                 StatisticsAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (1 <= num_statistics_order_ &&
      buffer->first_order_statistics_.size() != length) {
    buffer->first_order_statistics_.resize(length);
  }
  if (2 <= num_statistics_order_ &&
      buffer->second_order_statistics_.GetNumDimension() !=
          static_cast<int>(length)) {
    buffer->second_order_statistics_.Resize(static_cast<int>(length));
  }
  if (numerically_stable_ && buffer->delta_.size() != length) {
    buffer->delta_.resize(length);
  }

  // Accumulate 0th order statistics.
  ++(buffer->zeroth_order_statistics_);

  // Compute delta.
  if (1 <= num_statistics_order_ && numerically_stable_) {
    std::transform(data.begin(), data.end(),
                   buffer->first_order_statistics_.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  // Accumulate 2nd order statistics.
  if (2 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double n(static_cast<double>(buffer->zeroth_order_statistics_));
      const double z((n - 1) / n);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += z * delta[i] * delta[j];
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += data[i] * data[j];
        }
      }
    }
  }

  // Accumulate 1st order statistics.
  if (1 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double z(1.0 / buffer->zeroth_order_statistics_);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     buffer->first_order_statistics_.begin(),
                     buffer->first_order_statistics_.begin(),
                     [z](double d, double a) { return a + z * d; });
    } else {
      std::transform(
          data.begin(), data.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}